

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall
fasttext::FastText::test(FastText *this,istream *in,int32_t k,real threshold,Meter *meter)

{
  int iVar1;
  double __x;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> predictions;
  undefined1 local_98 [16];
  pointer local_88;
  undefined1 local_78 [16];
  pointer local_68;
  undefined1 local_58 [16];
  pointer local_48;
  Meter *local_38;
  
  local_98._0_12_ = ZEXT812(0);
  local_98._12_4_ = 0;
  local_68 = (pointer)0x0;
  local_88 = (pointer)0x0;
  local_48 = (pointer)0x0;
  local_78 = local_98;
  local_58 = local_98;
  local_38 = meter;
  while( true ) {
    iVar1 = std::istream::peek();
    if (iVar1 == -1) break;
    if (local_78._8_8_ != local_78._0_8_) {
      local_78._8_8_ = local_78._0_8_;
    }
    if (local_98._8_8_ != local_98._0_8_) {
      local_98._8_8_ = local_98._0_8_;
    }
    Dictionary::getLine((this->dict_).
                        super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        in,(vector<int,_std::allocator<int>_> *)local_78,
                        (vector<int,_std::allocator<int>_> *)local_98);
    if ((local_98._0_8_ != local_98._8_8_) && (local_78._0_8_ != local_78._8_8_)) {
      if (local_58._8_8_ != local_58._0_8_) {
        local_58._8_8_ = local_58._0_8_;
      }
      __x = (double)(ulong)(uint)threshold;
      predict(this,k,(vector<int,_std::allocator<int>_> *)local_78,
              (vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)local_58,
              threshold);
      Meter::log(local_38,__x);
    }
  }
  std::_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::~_Vector_base
            ((_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
             local_58);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_98);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_78);
  return;
}

Assistant:

void FastText::test(std::istream& in, int32_t k, real threshold, Meter& meter)
		const {
	std::vector<int32_t> line;
	std::vector<int32_t> labels;
	std::vector<std::pair<real, int32_t>> predictions;

	while (in.peek() != EOF) {
		line.clear();
		labels.clear();
		dict_->getLine(in, line, labels);

		if (!labels.empty() && !line.empty()) {
			predictions.clear();
			predict(k, line, predictions, threshold);
			meter.log(labels, predictions);
		}
	}
}